

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void MListSetAt(Col_Word *nodePtr,size_t index,Col_Word element)

{
  byte *list;
  uint uVar1;
  size_t sVar2;
  Col_Word left;
  Col_Word CVar3;
  ulong uVar4;
  size_t first;
  Col_Word *nodePtr_00;
  size_t leftLength;
  Col_Word core;
  Col_Word local_58;
  Col_Word local_50;
  Col_Word local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = index - 1;
  local_40 = index + 0x26;
  local_48 = element;
LAB_00110d55:
  do {
    list = (byte *)*nodePtr;
    uVar1 = 0;
    if (list != (byte *)0x0) {
      if (((ulong)list & 0xf) == 0) {
        uVar1 = -(uint)((*list & 2) == 0) | *list & 0xfffffffe;
      }
      else {
        uVar1 = immediateWordTypes[(uint)list & 0x1f];
      }
    }
    switch((uVar1 + 6) * 0x40000000 | uVar1 + 6 >> 2) {
    case 0:
      local_58 = (ulong)list & 0xfffffffffffffff7;
      MListSetAt(&local_58,index,local_48);
      *nodePtr = local_58 | 8;
      return;
    case 8:
      *(Col_Word *)(list + index * 8 + 0x10) = local_48;
      return;
    case 9:
      if (list[1] != 0) goto switchD_00110da2_caseD_a;
      break;
    case 10:
      goto switchD_00110da2_caseD_a;
    case 0xb:
      uVar4 = (ulong)*(ushort *)(list + 2);
      if (uVar4 == 0) {
        uVar4 = Col_ListLength(*(Col_Word *)(list + 0x10));
      }
      sVar2 = index - uVar4;
      if (index < uVar4) {
        nodePtr_00 = (Col_Word *)(*nodePtr + 0x10);
        sVar2 = index;
      }
      else {
        nodePtr_00 = (Col_Word *)(*nodePtr + 0x18);
      }
      MListSetAt(nodePtr_00,sVar2,local_48);
      UpdateMConcatNode(*nodePtr);
      return;
    }
    sVar2 = Col_ListLength((Col_Word)list);
    if (sVar2 < 0x27) {
      local_58 = 0;
      local_50 = Col_NewMVector(0,sVar2,(Col_Word *)0x0);
      Col_TraverseListChunks(*nodePtr,0,sVar2,0,MergeListChunksProc,&local_58,(size_t *)0x0);
      CVar3 = local_50;
    }
    else {
      if (index < 0x26) {
        local_58 = 0;
        local_50 = Col_NewMVector(0,0x26,(Col_Word *)0x0);
        Col_TraverseListChunks(*nodePtr,0,0x26,0,MergeListChunksProc,&local_58,(size_t *)0x0);
        CVar3 = *nodePtr;
        first = 0x26;
        left = local_50;
LAB_00110ec8:
        CVar3 = Col_Sublist(CVar3,first,sVar2 - 1);
      }
      else {
        local_58 = 0;
        local_50 = Col_NewMVector(0,0x26,(Col_Word *)0x0);
        if (index < sVar2 - 0x26) {
          Col_TraverseListChunks(*nodePtr,index,0x26,0,MergeListChunksProc,&local_58,(size_t *)0x0);
          CVar3 = Col_Sublist(*nodePtr,0,local_38);
          left = NewMConcatList(CVar3,local_50);
          CVar3 = *nodePtr;
          first = local_40;
          goto LAB_00110ec8;
        }
        Col_TraverseListChunks
                  (*nodePtr,sVar2 - 0x26,0x26,0,MergeListChunksProc,&local_58,(size_t *)0x0);
        left = Col_Sublist(*nodePtr,0,sVar2 - 0x27);
        CVar3 = local_50;
      }
      CVar3 = NewMConcatList(left,CVar3);
    }
    *nodePtr = CVar3;
  } while( true );
switchD_00110da2_caseD_a:
  ConvertToMConcatNode(nodePtr);
  goto LAB_00110d55;
}

Assistant:

static void
MListSetAt(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to modify. May be
                             overwritten if converted to mutable. */
    size_t index,       /*!< Element index. */
    Col_Word element)   /*!< New element. */
{
    /*
     * Entry point for tail recursive calls.
     */

start:
    switch (WORD_TYPE(*nodePtr)) {
    /*
     * First mutable types...
     */

    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }
        if (index < leftLength) {
            /*
             * Recurse on left.
             */

            MListSetAt(&WORD_CONCATLIST_LEFT(*nodePtr), index, element);
        } else {
            /*
             * Recurse on right.
             */

            MListSetAt(&WORD_CONCATLIST_RIGHT(*nodePtr), index - leftLength,
                    element);
        }

        /*
         * Update & rebalance tree.
         */

        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_CIRCLIST: {
        /*
         * Recurse on core.
         */

        Col_Word core = WORD_CIRCLIST_CORE(*nodePtr);
        MListSetAt(&core, index, element);
        *nodePtr = WORD_CIRCLIST_NEW(core);
        return;
        }

    case WORD_TYPE_MVECTOR:
        /*
         * Set element.
         */

        WORD_VECTOR_ELEMENTS(*nodePtr)[index] = element;
        return;

    /*
     * ... then immediate and immutable types.
     */

    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        /*
         * Convert to mutable around index then retry.
         */

        ConvertToMutableAt(nodePtr, index);
        goto start;
    }
}